

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceProgram::IfcSpaceProgram(IfcSpaceProgram *this)

{
  *(undefined ***)&this->field_0x148 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcSpaceProgram";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__0088bc90);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x88bbb0;
  *(undefined8 *)&this->field_0x148 = 0x88bc78;
  *(undefined8 *)&this->field_0x88 = 0x88bbd8;
  *(undefined8 *)&this->field_0x98 = 0x88bc00;
  *(undefined8 *)&this->field_0xd0 = 0x88bc28;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>)._vptr_ObjectHelper =
       (_func_int **)0x88bc50;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceProgram,_5UL>).field_0x20 = 0;
  (this->MaxRequiredArea).have = false;
  (this->MinRequiredArea).have = false;
  (this->RequestedLocation).ptr.obj = (LazyObject *)0x0;
  (this->RequestedLocation).have = false;
  return;
}

Assistant:

IfcSpaceProgram() : Object("IfcSpaceProgram") {}